

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Probe.cpp
# Opt level: O1

void __thiscall helics::apps::Probe::runProbe(Probe *this)

{
  Endpoint *this_00;
  undefined8 *puVar1;
  element_type *peVar2;
  _func_int *p_Var3;
  bool bVar4;
  size_t __n;
  MessageFederate **ppMVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  string_view message_00;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> message;
  Message *local_a0;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  MessageFederate *local_68;
  size_type sStack_60;
  void *local_58;
  _Alloc_hider local_48;
  size_t local_40;
  
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78._M_allocated_capacity =
       *(undefined8 *)
        (&(peVar2->super_ValueFederate).field_0x28 +
        (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
  this_00 = &this->endpoint;
  bVar4 = Endpoint::hasMessage(this_00);
  if (bVar4) {
    local_78._8_8_ =
         (double)((long)local_78._M_allocated_capacity % 1000000000) * 1e-09 +
         (double)((long)local_78._M_allocated_capacity / 1000000000);
    do {
      Endpoint::getMessage((Endpoint *)&local_a0);
      peVar2 = (this->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var3 = (peVar2->super_ValueFederate)._vptr_ValueFederate[-3];
      local_40 = (local_a0->data).bufferSize;
      local_48._M_p = (pointer)(local_a0->data).heap;
      local_68 = (MessageFederate *)(local_a0->source)._M_dataplus._M_p;
      sStack_60 = (local_a0->source)._M_string_length;
      local_58 = (void *)local_78._8_8_;
      fmt.size_ = 0xdad;
      fmt.data_ = &DAT_00000020;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v11::vformat_abi_cxx11_(&local_98,(v11 *)"Message from {} at Time {}: [{}]",fmt,args);
      message_00._M_str = local_98._M_dataplus._M_p;
      message_00._M_len = local_98._M_string_length;
      Federate::logMessage
                ((Federate *)
                 ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate + (long)p_Var3),6,
                 message_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,
                        (ulong)(local_98.field_2._M_allocated_capacity + 1));
      }
      this->messagesReceived = this->messagesReceived + 1;
      if (local_a0 != (Message *)0x0) {
        CLI::std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)&local_a0,local_a0);
      }
      bVar4 = Endpoint::hasMessage(this_00);
    } while (bVar4);
  }
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58 = (void *)((double)((long)local_78._M_allocated_capacity % 1000000000) * 1e-09 +
                     (double)((long)local_78._M_allocated_capacity / 1000000000));
  puVar1 = (undefined8 *)
           (&(peVar2->super_ValueFederate).field_0x78 +
           (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
  local_68 = (MessageFederate *)*puVar1;
  sStack_60 = puVar1[1];
  ppMVar5 = &local_68;
  fmt_00.size_ = 0xad;
  fmt_00.data_ = (char *)0x17;
  __n = 0xad;
  args_00.field_1.values_ = in_R9.values_;
  args_00.desc_ = (unsigned_long_long)ppMVar5;
  ::fmt::v11::vformat_abi_cxx11_(&local_98,(v11 *)"message from {},time {}",fmt_00,args_00);
  Endpoint::send(this_00,(int)local_98._M_dataplus._M_p,(void *)local_98._M_string_length,__n,
                 (int)ppMVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,(ulong)(local_98.field_2._M_allocated_capacity + 1));
  }
  return;
}

Assistant:

void Probe::runProbe()
{
    auto ctime = fed->getCurrentTime();
    while (endpoint.hasMessage()) {
        auto message = endpoint.getMessage();
        fed->logInfoMessage(fmt::format("Message from {} at Time {}: [{}]",
                                        message->source,
                                        static_cast<double>(ctime),
                                        message->to_string()));
        ++messagesReceived;
    }
    endpoint.send(
        fmt::format("message from {},time {}", fed->getName(), static_cast<double>(ctime)));
}